

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_convert_path_separator_1(archive_string *fn,uchar attr)

{
  bool bVar1;
  wchar_t mb;
  size_t i;
  uchar attr_local;
  archive_string *fn_local;
  wchar_t local_4;
  
  bVar1 = false;
  for (i = 0; i < fn->length; i = i + 1) {
    if (fn->s[i] == '\\') {
      if (bVar1) break;
      fn->s[i] = '/';
      bVar1 = false;
    }
    else if ((((int)fn->s[i] & 0x80U) == 0) || ((attr & 0x80) != 0)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  if (i == fn->length) {
    local_4 = L'\0';
  }
  else {
    local_4 = L'\xffffffff';
  }
  return local_4;
}

Assistant:

static int
cab_convert_path_separator_1(struct archive_string *fn, unsigned char attr)
{
	size_t i;
	int mb;

	/* Easy check if we have '\' in multi-byte string. */
	mb = 0;
	for (i = 0; i < archive_strlen(fn); i++) {
		if (fn->s[i] == '\\') {
			if (mb) {
				/* This may be second byte of multi-byte
				 * character. */
				break;
			}
			fn->s[i] = '/';
			mb = 0;
		} else if ((fn->s[i] & 0x80) && !(attr & ATTR_NAME_IS_UTF))
			mb = 1;
		else
			mb = 0;
	}
	if (i == archive_strlen(fn))
		return (0);
	return (-1);
}